

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O1

int read_CPR(coda_cdf_product *product_file,int64_t offset)

{
  ushort uVar1;
  ushort uVar2;
  undefined1 uVar3;
  int iVar4;
  char *message;
  int32_t ctype;
  int32_t record_type;
  undefined4 local_20;
  undefined4 local_1c;
  
  if (offset == 0) {
    return 0;
  }
  iVar4 = read_bytes(product_file->raw_product,offset + 8,4,&local_1c);
  if (-1 < iVar4) {
    uVar3 = (undefined1)local_1c;
    uVar1 = local_1c._1_2_ << 8;
    uVar2 = local_1c._1_2_ >> 8;
    local_1c = CONCAT13(uVar3,CONCAT21(uVar1 | uVar2,local_1c._3_1_));
    if (local_1c == 0xb) {
      iVar4 = read_bytes(product_file->raw_product,offset + 0xc,4,&local_20);
      if (iVar4 < 0) {
        return -1;
      }
      uVar3 = (undefined1)local_20;
      uVar1 = local_20._1_2_ << 8;
      uVar2 = local_20._1_2_ >> 8;
      local_20 = CONCAT13(uVar3,CONCAT21(uVar1 | uVar2,local_20._3_1_));
      if (local_20 == 5) {
        return 0;
      }
      message = "Unsupported compression method (%d) for CDF variable";
      iVar4 = -200;
    }
    else {
      message = "CDF file has invalid record type (%d) for CPR record";
      iVar4 = -300;
    }
    coda_set_error(iVar4,message);
  }
  return -1;
}

Assistant:

static int read_CPR(coda_cdf_product *product_file, int64_t offset)
{
    int32_t record_type;
    int32_t ctype;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 11)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for CPR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 4, &ctype) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&ctype);
#endif
    if (ctype != 5)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "Unsupported compression method (%d) for CDF variable", ctype);
        return -1;
    }

    return 0;
}